

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes.c
# Opt level: O2

void aes_ecb_decrypt(aes_context *ctx,uint8_t *input,uint8_t *output)

{
  uint32_t uVar1;
  uint uVar2;
  uint32_t *puVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  bool bVar12;
  
  uVar1 = get32be(input);
  uVar11 = uVar1 ^ ctx->key[0];
  uVar1 = get32be(input + 4);
  uVar9 = uVar1 ^ ctx->key[1];
  uVar1 = get32be(input + 8);
  uVar10 = uVar1 ^ ctx->key[2];
  uVar1 = get32be(input + 0xc);
  uVar2 = uVar1 ^ ctx->key[3];
  uVar8 = *(uint *)((long)TD + (ulong)(uVar2 >> 0xe & 0x3fc));
  uVar4 = (TD[uVar9 & 0xff] << 8 | TD[uVar9 & 0xff] >> 0x18) ^
          (TD[uVar10 >> 8 & 0xff] << 0x10 | TD[uVar10 >> 8 & 0xff] >> 0x10) ^
          (uVar8 << 0x18 | uVar8 >> 8) ^ TD[uVar11 >> 0x18] ^ ctx->key[4];
  uVar8 = *(uint *)((long)TD + (ulong)(uVar11 >> 0xe & 0x3fc));
  uVar5 = (TD[uVar10 & 0xff] << 8 | TD[uVar10 & 0xff] >> 0x18) ^
          (TD[uVar2 >> 8 & 0xff] << 0x10 | TD[uVar2 >> 8 & 0xff] >> 0x10) ^
          (uVar8 << 0x18 | uVar8 >> 8) ^ TD[uVar9 >> 0x18] ^ ctx->key[5];
  uVar8 = *(uint *)((long)TD + (ulong)(uVar9 >> 0xe & 0x3fc));
  uVar6 = (TD[uVar2 & 0xff] << 8 | TD[uVar2 & 0xff] >> 0x18) ^
          (TD[uVar11 >> 8 & 0xff] << 0x10 | TD[uVar11 >> 8 & 0xff] >> 0x10) ^
          (uVar8 << 0x18 | uVar8 >> 8) ^ TD[uVar10 >> 0x18] ^ ctx->key[6];
  uVar8 = *(uint *)((long)TD + (ulong)(uVar10 >> 0xe & 0x3fc));
  puVar3 = ctx->key;
  uVar8 = (TD[uVar11 & 0xff] << 8 | TD[uVar11 & 0xff] >> 0x18) ^
          (TD[uVar9 >> 8 & 0xff] << 0x10 | TD[uVar9 >> 8 & 0xff] >> 0x10) ^
          (uVar8 << 0x18 | uVar8 >> 8) ^ TD[uVar2 >> 0x18] ^ ctx->key[7];
  lVar7 = (long)((ctx->nr >> 1) + -1);
  while( true ) {
    puVar3 = puVar3 + 8;
    bVar12 = lVar7 == 0;
    lVar7 = lVar7 + -1;
    if (bVar12) break;
    uVar2 = *(uint *)((long)TD + (ulong)(uVar8 >> 0xe & 0x3fc));
    uVar10 = (TD[uVar5 & 0xff] << 8 | TD[uVar5 & 0xff] >> 0x18) ^
             (TD[uVar6 >> 8 & 0xff] << 0x10 | TD[uVar6 >> 8 & 0xff] >> 0x10) ^
             (uVar2 << 0x18 | uVar2 >> 8) ^ TD[uVar4 >> 0x18] ^ *puVar3;
    uVar2 = *(uint *)((long)TD + (ulong)(uVar4 >> 0xe & 0x3fc));
    uVar11 = (TD[uVar6 & 0xff] << 8 | TD[uVar6 & 0xff] >> 0x18) ^
             (TD[uVar8 >> 8 & 0xff] << 0x10 | TD[uVar8 >> 8 & 0xff] >> 0x10) ^
             (uVar2 << 0x18 | uVar2 >> 8) ^ TD[uVar5 >> 0x18] ^ puVar3[1];
    uVar2 = *(uint *)((long)TD + (ulong)(uVar5 >> 0xe & 0x3fc));
    uVar9 = (TD[uVar8 & 0xff] << 8 | TD[uVar8 & 0xff] >> 0x18) ^
            (TD[uVar4 >> 8 & 0xff] << 0x10 | TD[uVar4 >> 8 & 0xff] >> 0x10) ^
            (uVar2 << 0x18 | uVar2 >> 8) ^ TD[uVar6 >> 0x18] ^ puVar3[2];
    uVar2 = *(uint *)((long)TD + (ulong)(uVar6 >> 0xe & 0x3fc));
    uVar2 = (TD[uVar4 & 0xff] << 8 | TD[uVar4 & 0xff] >> 0x18) ^
            (TD[uVar5 >> 8 & 0xff] << 0x10 | TD[uVar5 >> 8 & 0xff] >> 0x10) ^
            (uVar2 << 0x18 | uVar2 >> 8) ^ TD[uVar8 >> 0x18] ^ puVar3[3];
    uVar8 = *(uint *)((long)TD + (ulong)(uVar2 >> 0xe & 0x3fc));
    uVar4 = (TD[uVar11 & 0xff] << 8 | TD[uVar11 & 0xff] >> 0x18) ^
            (TD[uVar9 >> 8 & 0xff] << 0x10 | TD[uVar9 >> 8 & 0xff] >> 0x10) ^
            (uVar8 << 0x18 | uVar8 >> 8) ^ TD[uVar10 >> 0x18] ^ puVar3[4];
    uVar8 = *(uint *)((long)TD + (ulong)(uVar10 >> 0xe & 0x3fc));
    uVar5 = (TD[uVar9 & 0xff] << 8 | TD[uVar9 & 0xff] >> 0x18) ^
            (TD[uVar2 >> 8 & 0xff] << 0x10 | TD[uVar2 >> 8 & 0xff] >> 0x10) ^
            (uVar8 << 0x18 | uVar8 >> 8) ^ TD[uVar11 >> 0x18] ^ puVar3[5];
    uVar8 = *(uint *)((long)TD + (ulong)(uVar11 >> 0xe & 0x3fc));
    uVar6 = (TD[uVar2 & 0xff] << 8 | TD[uVar2 & 0xff] >> 0x18) ^
            (TD[uVar10 >> 8 & 0xff] << 0x10 | TD[uVar10 >> 8 & 0xff] >> 0x10) ^
            (uVar8 << 0x18 | uVar8 >> 8) ^ TD[uVar9 >> 0x18] ^ puVar3[6];
    uVar8 = *(uint *)((long)TD + (ulong)(uVar9 >> 0xe & 0x3fc));
    uVar8 = (TD[uVar10 & 0xff] << 8 | TD[uVar10 & 0xff] >> 0x18) ^
            (TD[uVar11 >> 8 & 0xff] << 0x10 | TD[uVar11 >> 8 & 0xff] >> 0x10) ^
            (uVar8 << 0x18 | uVar8 >> 8) ^ TD[uVar2 >> 0x18] ^ puVar3[7];
  }
  uVar10 = ((uint)Td[uVar5 & 0xff] |
           (uint)Td[uVar6 >> 8 & 0xff] << 8 |
           (uint)Td[uVar8 >> 0x10 & 0xff] << 0x10 | (uint)Td[uVar4 >> 0x18] << 0x18) ^ *puVar3;
  uVar9 = ((uint)Td[uVar6 & 0xff] |
          (uint)Td[uVar8 >> 8 & 0xff] << 8 |
          (uint)Td[uVar4 >> 0x10 & 0xff] << 0x10 | (uint)Td[uVar5 >> 0x18] << 0x18) ^ puVar3[1];
  uVar2 = ((uint)Td[uVar8 & 0xff] |
          (uint)Td[uVar4 >> 8 & 0xff] << 8 |
          (uint)Td[uVar5 >> 0x10 & 0xff] << 0x10 | (uint)Td[uVar6 >> 0x18] << 0x18) ^ puVar3[2];
  uVar8 = ((uint)Td[uVar4 & 0xff] |
          (uint)Td[uVar5 >> 8 & 0xff] << 8 |
          (uint)Td[uVar6 >> 0x10 & 0xff] << 0x10 | (uint)Td[uVar8 >> 0x18] << 0x18) ^ puVar3[3];
  *output = (uint8_t)(uVar10 >> 0x18);
  output[1] = (uint8_t)(uVar10 >> 0x10);
  output[2] = (uint8_t)(uVar10 >> 8);
  output[3] = (uint8_t)uVar10;
  output[4] = (uint8_t)(uVar9 >> 0x18);
  output[5] = (uint8_t)(uVar9 >> 0x10);
  output[6] = (uint8_t)(uVar9 >> 8);
  output[7] = (uint8_t)uVar9;
  output[8] = (uint8_t)(uVar2 >> 0x18);
  output[9] = (uint8_t)(uVar2 >> 0x10);
  output[10] = (uint8_t)(uVar2 >> 8);
  output[0xb] = (uint8_t)uVar2;
  output[0xc] = (uint8_t)(uVar8 >> 0x18);
  output[0xd] = (uint8_t)(uVar8 >> 0x10);
  output[0xe] = (uint8_t)(uVar8 >> 8);
  output[0xf] = (uint8_t)uVar8;
  return;
}

Assistant:

void aes_ecb_decrypt(const aes_context* ctx, const uint8_t* input, uint8_t* output)
{
#if PLATFORM_SUPPORTS_AESNI
    if (aes_supported_x86())
    {
        aes_ecb_decrypt_x86(ctx, input, output);
        return;
    }
#endif
    aes_decrypt(ctx, input, output);
}